

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperationsBuilder.cpp
# Opt level: O2

void __thiscall
Refal2::COperationsBuilder::AddMatchLeft_S
          (COperationsBuilder *this,CQualifier *qualifier,bool saveInTable)

{
  bool bVar1;
  
  bVar1 = CQualifier::IsEmpty(qualifier);
  if (bVar1) {
    addOperation(this,saveInTable + OT_MatchLeft_S);
    return;
  }
  addQualifierIndexOperation(this,saveInTable + OT_MatchLeftWithQualifier_S,qualifier);
  return;
}

Assistant:

void COperationsBuilder::AddMatchLeft_S( CQualifier& qualifier,
	bool saveInTable )
{
	DEBUG_PRINT( __FUNCTION__ )
	if( qualifier.IsEmpty() ) {
		addNoArgumensOperation(
			( saveInTable ? OT_MatchLeftSaveToTable_S : OT_MatchLeft_S ) );
	} else {
		addQualifierIndexOperation(
			( saveInTable ? OT_MatchLeftWithQualifierSaveToTable_S :
			OT_MatchLeftWithQualifier_S ), qualifier );
	}
}